

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O3

void Vec_VecExpand(Vec_Vec_t *p,int Level)

{
  int iVar1;
  void **ppvVar2;
  void *pvVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = p->nSize;
  if (iVar5 <= Level) {
    iVar1 = Level + 1;
    if (p->nCap <= Level) {
      if (p->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((long)iVar1 << 3);
      }
      else {
        ppvVar2 = (void **)realloc(p->pArray,(long)iVar1 << 3);
        iVar5 = p->nSize;
      }
      p->pArray = ppvVar2;
      p->nCap = iVar1;
    }
    if (iVar5 <= Level) {
      lVar4 = (long)iVar5;
      iVar5 = (Level - iVar5) + 1;
      do {
        pvVar3 = calloc(1,0x10);
        p->pArray[lVar4] = pvVar3;
        lVar4 = lVar4 + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    p->nSize = iVar1;
  }
  return;
}

Assistant:

static inline void Vec_VecExpand( Vec_Vec_t * p, int Level )
{
    int i;
    if ( p->nSize >= Level + 1 )
        return;
    Vec_PtrGrow( (Vec_Ptr_t *)p, Level + 1 );
    for ( i = p->nSize; i <= Level; i++ )
        p->pArray[i] = Vec_PtrAlloc( 0 );
    p->nSize = Level + 1;
}